

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_get_pk_alg(uchar **p,uchar *end,mbedtls_pk_type_t *pk_alg,mbedtls_asn1_buf *params,
                 mbedtls_ecp_group_id *ec_grp_id)

{
  undefined1 local_58 [8];
  mbedtls_asn1_buf alg_oid;
  int ret;
  mbedtls_ecp_group_id *ec_grp_id_local;
  mbedtls_asn1_buf *params_local;
  mbedtls_pk_type_t *pk_alg_local;
  uchar *end_local;
  uchar **p_local;
  
  alg_oid.p._4_4_ = 0xffffff92;
  memset(params,0,0x18);
  alg_oid.p._4_4_ = mbedtls_asn1_get_alg(p,end,(mbedtls_asn1_buf *)local_58,params);
  if (alg_oid.p._4_4_ == 0) {
    alg_oid.p._4_4_ = mbedtls_oid_get_pk_alg((mbedtls_asn1_buf *)local_58,pk_alg);
    if ((alg_oid.p._4_4_ == -0x2e) &&
       (alg_oid.p._4_4_ = mbedtls_oid_get_ec_grp_algid((mbedtls_asn1_buf *)local_58,ec_grp_id),
       alg_oid.p._4_4_ == 0)) {
      *pk_alg = MBEDTLS_PK_ECKEY;
    }
    if (alg_oid.p._4_4_ == 0) {
      if ((*pk_alg == MBEDTLS_PK_RSA) &&
         (((params->tag != 5 && (params->tag != 0)) || (params->len != 0)))) {
        p_local._4_4_ = -0x3a80;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = -0x3c80;
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x3a80,alg_oid.p._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                           ,0x34e);
  }
  return p_local._4_4_;
}

Assistant:

static int pk_get_pk_alg(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_pk_type_t *pk_alg, mbedtls_asn1_buf *params,
                         mbedtls_ecp_group_id *ec_grp_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf alg_oid;

    memset(params, 0, sizeof(mbedtls_asn1_buf));

    if ((ret = mbedtls_asn1_get_alg(p, end, &alg_oid, params)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_ALG, ret);
    }

    ret = mbedtls_oid_get_pk_alg(&alg_oid, pk_alg);
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (ret == MBEDTLS_ERR_OID_NOT_FOUND) {
        ret = mbedtls_oid_get_ec_grp_algid(&alg_oid, ec_grp_id);
        if (ret == 0) {
            *pk_alg = MBEDTLS_PK_ECKEY;
        }
    }
#else
    (void) ec_grp_id;
#endif
    if (ret != 0) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    /*
     * No parameters with RSA (only for EC)
     */
    if (*pk_alg == MBEDTLS_PK_RSA &&
        ((params->tag != MBEDTLS_ASN1_NULL && params->tag != 0) ||
         params->len != 0)) {
        return MBEDTLS_ERR_PK_INVALID_ALG;
    }

    return 0;
}